

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txt_to_cpp.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  ofstream fo;
  ifstream fi;
  long local_438;
  filebuf local_430 [24];
  byte abStack_418 [216];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  if (argc == 4) {
    std::ofstream::ofstream(&local_438,argv[1],_S_out);
    std::ifstream::ifstream(local_238,argv[2],_S_in);
    iVar3 = 2;
    if (((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) &&
       ((abStack_418[*(long *)(local_438 + -0x18)] & 5) == 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,"char ",5);
      __s = argv[3];
      if (__s == (char *)0x0) {
        std::ios::clear((int)&local_438 + (int)*(undefined8 *)(local_438 + -0x18));
      }
      else {
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,__s,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,"[] = {",6);
      uVar1 = 0;
      do {
        uVar2 = uVar1;
        iVar3 = std::istream::get();
        if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) != 0) {
          iVar3 = 0;
        }
        if (uVar2 == 0) {
LAB_001014ed:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,"\n    ",5);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,", ",2);
          if ((uVar2 & 0xf) == 0) goto LAB_001014ed;
        }
        std::ostream::operator<<((ostream *)&local_438,iVar3);
        uVar1 = uVar2 + 1;
      } while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0);
      if (uVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,"\n",1);
      }
      iVar3 = 0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,"};\n",3);
    }
    std::ifstream::~ifstream(local_238);
    local_438 = _VTT;
    *(undefined8 *)(local_430 + *(long *)(_VTT + -0x18) + -8) = _widen;
    std::filebuf::~filebuf(local_430);
    std::ios_base::~ios_base(local_340);
  }
  else {
    iVar3 = 1;
    usage(*argv,"nb args",1);
  }
  return iVar3;
}

Assistant:

int main( int argc, char **argv ) {
    if ( argc != 4 )
        return usage( argv[ 0 ], "nb args", 1 );
    std::ofstream fo( argv[ 1 ] );
    std::ifstream fi( argv[ 2 ] );
    if ( not fi or not fo )
        return 2;

    fo << "char " << argv[ 3 ] << "[] = {";
    for( int i = 0; ; ++i ) {
        int c = fi.get();
        if ( fi.eof() )
            c = 0;

        if ( i )
            fo << ", ";
        if ( i % 16 == 0 )
            fo << "\n    ";
        fo << c;

        if ( fi.eof() ) {
            if ( i )
                fo << "\n";
            break;
        }
    }
    fo << "};\n";

    return 0;
}